

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void deserialize_node<_IO_FILE*,int,unsigned_long>
               (SingleTreeIndex *node,_IO_FILE **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian)

{
  size_t vec_size;
  bool *local_28;
  
  if (!interrupt_switch) {
    local_28 = &interrupt_switch;
    read_bytes<unsigned_long>(&local_28,1,in);
    if (diff_endian) {
      deserialize_node<_IO_FILE*,int,unsigned_long>();
    }
    else {
      read_bytes<unsigned_long>(&node->terminal_node_mappings,(size_t)local_28,in);
      read_bytes<unsigned_long>(&local_28,1,in);
      read_bytes<double>(&node->node_distances,(size_t)local_28,in);
      read_bytes<unsigned_long>(&local_28,1,in);
      read_bytes<double>(&node->node_depths,(size_t)local_28,in);
      read_bytes<unsigned_long>(&local_28,1,in);
      read_bytes<unsigned_long>(&node->reference_points,(size_t)local_28,in);
      read_bytes<unsigned_long>(&local_28,1,in);
      read_bytes<unsigned_long>(&node->reference_indptr,(size_t)local_28,in);
      read_bytes<unsigned_long>(&local_28,1,in);
      read_bytes<unsigned_long>(&node->reference_mapping,(size_t)local_28,in);
      read_bytes<unsigned_long>(&node->n_terminal,1,in);
    }
  }
  return;
}

Assistant:

void deserialize_node(SingleTreeIndex &node, itype &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (interrupt_switch) return;

    size_t vec_size;
    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.terminal_node_mappings, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<double, double>(node.node_distances, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<double, double>(node.node_depths, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_points, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_indptr, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_mapping, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&node.n_terminal, (size_t)1, in, buffer, diff_endian);
}